

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

result<sockpp::stream_socket> *
sockpp::stream_socket::create
          (result<sockpp::stream_socket> *__return_storage_ptr__,int domain,int protocol)

{
  bool bVar1;
  error_code *err;
  int *piVar2;
  stream_socket local_40;
  undefined1 local_30 [8];
  result<int> res;
  int protocol_local;
  int domain_local;
  
  res.err_._M_cat._0_4_ = protocol;
  res.err_._M_cat._4_4_ = domain;
  create_handle((result<int> *)local_30,domain,protocol);
  bVar1 = sockpp::result::operator_cast_to_bool((result *)local_30);
  if (bVar1) {
    piVar2 = result<int>::value((result<int> *)local_30);
    stream_socket(&local_40,*piVar2);
    result<sockpp::stream_socket>::result(__return_storage_ptr__,&local_40);
    ~stream_socket(&local_40);
  }
  else {
    err = result<int>::error((result<int> *)local_30);
    result<sockpp::stream_socket>::result(__return_storage_ptr__,err);
  }
  return __return_storage_ptr__;
}

Assistant:

result<stream_socket> stream_socket::create(int domain, int protocol /*=0*/) {
    if (auto res = create_handle(domain, protocol); !res)
        return res.error();
    else
        return stream_socket{res.value()};
}